

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::handleFunctionCall
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped *arguments)

{
  undefined1 *puVar1;
  pointer pbVar2;
  pointer ppTVar3;
  TIntermediate *pTVar4;
  TString name;
  TString structName;
  TIntermTyped *pTVar5;
  bool bVar6;
  TOperator TVar7;
  int iVar8;
  int iVar9;
  TPoolAllocator *pTVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar11;
  undefined4 extraout_var_01;
  long *plVar12;
  TType *pTVar13;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TSymbol *pTVar14;
  undefined4 extraout_var_05;
  TFunction *function_00;
  undefined4 extraout_var_06;
  TIntermSymbol *front;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TIntermConstantUnion *pTVar15;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_> *this_00;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  TTypeList *pTVar16;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TIntermConstantUnion *pTVar17;
  TOperator op;
  int i;
  uint uVar18;
  HlslParseContext *this_01;
  int memb;
  long lStackY_190;
  undefined8 uStack_178;
  TIntermTyped *arguments_local;
  TIntermConstantUnion *local_168;
  TIntermediate *local_160;
  bool builtIn;
  undefined7 uStack_157;
  int thisDepth;
  undefined4 uStack_14c;
  TIntermConstantUnion *local_148;
  TStorageQualifier qual;
  undefined4 uStack_13c;
  pointer local_138;
  TType type;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  local_168 = (TIntermConstantUnion *)0x0;
  arguments_local = arguments;
  TVar7 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
  if (TVar7 != EOpNull) {
    TType::TType(&type,EbtVoid,EvqTemporary,1,0,0,false);
    bVar6 = constructorError(this,loc,&arguments_local->super_TIntermNode,function,TVar7,&type);
    pTVar17 = (TIntermConstantUnion *)0x0;
    if ((!bVar6) &&
       (local_168 = (TIntermConstantUnion *)handleConstructor(this,loc,arguments_local,&type),
       pTVar17 = local_168, local_168 == (TIntermConstantUnion *)0x0)) {
      pTVar10 = GetThreadPoolAllocator();
      thisDepth = (int)pTVar10;
      uStack_14c = (undefined4)((ulong)pTVar10 >> 0x20);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_58,"",(pool_allocator<char> *)&thisDepth);
      pTVar10 = GetThreadPoolAllocator();
      builtIn = SUB81(pTVar10,0);
      uStack_157 = (undefined7)((ulong)pTVar10 >> 8);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>(local_80,"",(pool_allocator<char> *)&builtIn);
      name._M_dataplus._M_p = (pointer)local_80;
      name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_58;
      name._M_string_length = uStack_178;
      name.field_2._M_allocated_capacity = (size_type)arguments_local;
      name.field_2._8_8_ = local_168;
      structName._M_dataplus._M_p._0_1_ = builtIn;
      structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_160;
      structName._M_dataplus._M_p._1_7_ = uStack_157;
      structName._M_string_length._0_4_ = thisDepth;
      structName._M_string_length._4_4_ = uStack_14c;
      structName.field_2._M_allocated_capacity = (size_type)local_148;
      structName.field_2._8_4_ = qual;
      structName.field_2._12_4_ = uStack_13c;
      TType::getCompleteString((TString *)&qual,&type,false,true,true,true,name,structName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot construct with these arguments",local_138,"");
      return (TIntermTyped *)0x0;
    }
    goto LAB_0038d8a3;
  }
  builtIn = false;
  thisDepth = 0;
  iVar8 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var,iVar8),"mul");
  if (bVar6) {
    addGenMulArgumentConversion(this,loc,function,&arguments_local);
    arguments = arguments_local;
  }
  if (arguments == (TIntermTyped *)0x0) {
LAB_0038d3f1:
    function_00 = findFunction(this,loc,function,&builtIn,&thisDepth,&arguments_local);
    if (function_00 == (TFunction *)0x0) {
      pTVar17 = (TIntermConstantUnion *)0x0;
      goto LAB_0038d8a3;
    }
  }
  else {
    iVar8 = (*(arguments->super_TIntermNode)._vptr_TIntermNode[6])(arguments);
    plVar12 = (long *)CONCAT44(extraout_var_00,iVar8);
    if (((plVar12 == (long *)0x0) ||
        (lVar11 = (**(code **)(*plVar12 + 400))(plVar12),
        *(long *)(lVar11 + 0x10) == *(long *)(lVar11 + 8))) ||
       (lVar11 = (**(code **)(*plVar12 + 400))(plVar12), **(long **)(lVar11 + 8) == 0)) {
      iVar8 = (*(arguments->super_TIntermNode)._vptr_TIntermNode[0xc])(arguments);
      if (CONCAT44(extraout_var_01,iVar8) == 0) goto LAB_0038d3f1;
      lStackY_190 = 0x60;
    }
    else {
      lVar11 = (**(code **)(*plVar12 + 400))(plVar12);
      arguments = (TIntermTyped *)**(undefined8 **)(lVar11 + 8);
      lStackY_190 = 0x18;
    }
    plVar12 = (long *)(**(code **)((long)(arguments->super_TIntermNode)._vptr_TIntermNode +
                                  lStackY_190))(arguments);
    if (plVar12 == (long *)0x0) goto LAB_0038d3f1;
    pTVar13 = (TType *)(**(code **)(*plVar12 + 0xf0))(plVar12);
    bVar6 = isStructBufferType(this,pTVar13);
    if ((!bVar6) ||
       (iVar8 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function),
       *(ulong *)(CONCAT44(extraout_var_02,iVar8) + 0x10) < 6)) goto LAB_0038d3f1;
    iVar8 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    this_01 = (HlslParseContext *)&type;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               CONCAT44(extraout_var_03,iVar8),5,0xffffffffffffffff);
    bVar6 = isStructBufferMethod(this_01,(TString *)&type);
    if (!bVar6) goto LAB_0038d3f1;
    iVar8 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   &type,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_04,iVar8),"(");
    pTVar14 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,(TString *)&type,
                                 &builtIn,(bool *)0x0,(int *)0x0);
    if (pTVar14 == (TSymbol *)0x0) goto LAB_0038d3f1;
    iVar8 = (*pTVar14->_vptr_TSymbol[7])(pTVar14);
    function_00 = (TFunction *)CONCAT44(extraout_var_05,iVar8);
    if (function_00 == (TFunction *)0x0) goto LAB_0038d3f1;
  }
  puVar1 = &type.qualifier.field_0x8;
  type._vptr_TType = (_func_int **)GetThreadPoolAllocator();
  type.qualifier.semanticName = (char *)0x0;
  type.qualifier._8_1_ = 0;
  type._8_8_ = puVar1;
  if ((long)thisDepth == 0) {
    iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              CONCAT44(extraout_var_07,iVar8));
  }
  else {
    pbVar2 = (this->currentTypePrefix).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
              pbVar2 + (((long)(this->currentTypePrefix).
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) / 0x28 -
                       (long)thisDepth));
    iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               CONCAT44(extraout_var_06,iVar8));
    ppTVar3 = (this->implicitThisStack).
              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    front = TIntermediate::addSymbol
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                       ppTVar3[((ulong)((long)(this->implicitThisStack).
                                              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                              .
                                              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppTVar3) >> 3) - (long)thisDepth]);
    pushFrontArguments(this,&front->super_TIntermTyped,&arguments_local);
  }
  if (((arguments_local != (TIntermTyped *)0x0) &&
      (addInputArgumentConversions(this,function_00,&arguments_local),
      arguments_local != (TIntermTyped *)0x0)) &&
     ((builtIn != false ||
      (expandArguments(this,loc,function_00,&arguments_local),
      arguments_local != (TIntermTyped *)0x0)))) {
    (*(arguments_local->super_TIntermNode)._vptr_TIntermNode[6])();
  }
  TVar7 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00);
  pTVar5 = arguments_local;
  if ((TVar7 == EOpNull) || (builtIn == false)) {
    pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
    pTVar15 = (TIntermConstantUnion *)
              TIntermediate::setAggregateOperator
                        (pTVar4,&pTVar5->super_TIntermNode,EOpFunctionCall,
                         (TType *)CONCAT44(extraout_var_11,iVar8),loc);
    local_168 = pTVar15;
    iVar8 = (*(pTVar15->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(pTVar15);
    plVar12 = (long *)CONCAT44(extraout_var_12,iVar8);
    (**(code **)(*plVar12 + 0x1a0))(plVar12,&type);
    if (builtIn == false) {
      (**(code **)(*plVar12 + 0x1b0))(plVar12);
      TIntermediate::addToCallGraph
                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                 (this->super_TParseContextBase).super_TParseVersions.infoSink,&this->currentCaller,
                 (TString *)&type);
    }
  }
  else {
    op = EOpRoundEven;
    if (TVar7 != EOpRound ||
        ((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgHlslDX9Compatible) !=
        EShMsgDefault) {
      op = TVar7;
    }
    local_160 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
    pTVar5 = arguments_local;
    iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
    pTVar4 = local_160;
    local_160 = (TIntermediate *)loc;
    pTVar15 = (TIntermConstantUnion *)
              TIntermediate::addBuiltInFunctionCall
                        (pTVar4,loc,op,iVar8 == 1,&pTVar5->super_TIntermNode,
                         (TType *)CONCAT44(extraout_var_08,iVar9));
    local_168 = pTVar15;
    if (pTVar15 == (TIntermConstantUnion *)0x0) {
      iVar8 = (**(arguments_local->super_TIntermNode)._vptr_TIntermNode)();
      pTVar15 = (TIntermConstantUnion *)0x0;
      TIntermTyped::getCompleteString_abi_cxx11_((TString *)&qual,arguments_local,false);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,CONCAT44(extraout_var_13,iVar8)," wrong operand type","Internal Error",
                 "built in unary operator function.  Type: %s",local_138);
      loc = (TSourceLoc *)local_160;
    }
    else {
      iVar8 = (*(pTVar15->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])(pTVar15);
      loc = (TSourceLoc *)local_160;
      if (CONCAT44(extraout_var_09,iVar8) != 0) {
        iVar8 = (*(pTVar15->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])(pTVar15);
        loc = (TSourceLoc *)local_160;
        builtInOpCheck(this,(TSourceLoc *)local_160,function_00,
                       (TIntermOperator *)CONCAT44(extraout_var_10,iVar8));
      }
    }
  }
  decomposeStructBufferMethods
            (this,loc,(TIntermTyped **)&local_168,&arguments_local->super_TIntermNode);
  decomposeIntrinsic(this,loc,(TIntermTyped **)&local_168,&arguments_local->super_TIntermNode);
  decomposeSampleMethods(this,loc,(TIntermTyped **)&local_168,&arguments_local->super_TIntermNode);
  decomposeGeometryMethods(this,loc,(TIntermTyped **)&local_168,&arguments_local->super_TIntermNode)
  ;
  if ((local_168 == pTVar15) &&
     (iVar8 = (*(local_168->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(local_168),
     CONCAT44(extraout_var_14,iVar8) != 0)) {
    local_160 = (TIntermediate *)loc;
    local_148 = pTVar15;
    iVar8 = (*(local_168->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(local_168);
    this_00 = (vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>
               *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar8) + 0x1c0))
                           ((long *)CONCAT44(extraout_var_15,iVar8));
    for (uVar18 = 0; iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00),
        pTVar15 = local_148, loc = (TSourceLoc *)local_160, (int)uVar18 < iVar8; uVar18 = uVar18 + 1
        ) {
      iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar18);
      lVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_16,iVar8) + 8) + 0x50))();
      qual = *(TStorageQualifier *)(lVar11 + 8) & 0x7f;
      iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar18);
      lVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_17,iVar8) + 8) + 0x58))();
      if ((*(uint *)(lVar11 + 8) & 0x1fe0000) == 0x960000) {
        std::
        vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>::
        push_back(this_00,&qual);
LAB_0038d84b:
        std::
        vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>::
        push_back(this_00,&qual);
      }
      else {
        iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar18);
        pTVar13 = *(TType **)(CONCAT44(extraout_var_18,iVar8) + 8);
        iVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar18);
        lVar11 = (**(code **)(**(long **)(CONCAT44(extraout_var_19,iVar8) + 8) + 0x50))();
        bVar6 = shouldFlatten(this,pTVar13,*(TStorageQualifier *)(lVar11 + 8) & 0x7f,true);
        if (!bVar6) goto LAB_0038d84b;
        iVar8 = 0;
        while( true ) {
          iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar18);
          pTVar16 = TType::getStruct(*(TType **)(CONCAT44(extraout_var_20,iVar9) + 8));
          if ((int)((ulong)((long)(pTVar16->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar16->
                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                 ).
                                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) <= iVar8) break;
          std::
          vector<glslang::TStorageQualifier,_glslang::pool_allocator<glslang::TStorageQualifier>_>::
          push_back(this_00,&qual);
          iVar8 = iVar8 + 1;
        }
      }
    }
  }
  pTVar17 = local_168;
  if ((local_168 == pTVar15) &&
     (iVar8 = (*(local_168->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[6])(local_168),
     pTVar17 = local_168, CONCAT44(extraout_var_21,iVar8) != 0)) {
    iVar8 = (*(local_168->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[4])(local_168);
    pTVar17 = (TIntermConstantUnion *)
              addOutputArgumentConversions
                        (this,function_00,(TIntermOperator *)CONCAT44(extraout_var_22,iVar8));
    local_168 = pTVar17;
  }
LAB_0038d8a3:
  if (pTVar17 == (TIntermConstantUnion *)0x0) {
    pTVar17 = TIntermediate::addConstantUnion
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,
                         EbtFloat,loc,false);
  }
  return &pTVar17->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::handleFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermTyped* arguments)
{
    TIntermTyped* result = nullptr;

    TOperator op = function->getBuiltInOp();
    if (op != EOpNull) {
        //
        // Then this should be a constructor.
        // Don't go through the symbol table for constructors.
        // Their parameters will be verified algorithmically.
        //
        TType type(EbtVoid);  // use this to get the type back
        if (! constructorError(loc, arguments, *function, op, type)) {
            //
            // It's a constructor, of type 'type'.
            //
            result = handleConstructor(loc, arguments, type);
            if (result == nullptr) {
                error(loc, "cannot construct with these arguments", type.getCompleteString().c_str(), "");
                return nullptr;
            }
        }
    } else {
        //
        // Find it in the symbol table.
        //
        const TFunction* fnCandidate = nullptr;
        bool builtIn = false;
        int thisDepth = 0;

        // For mat mul, the situation is unusual: we have to compare vector sizes to mat row or col sizes,
        // and clamp the opposite arg.  Since that's complex, we farm it off to a separate method.
        // It doesn't naturally fall out of processing an argument at a time in isolation.
        if (function->getName() == "mul")
            addGenMulArgumentConversion(loc, *function, arguments);

        TIntermAggregate* aggregate = arguments ? arguments->getAsAggregate() : nullptr;

        // TODO: this needs improvement: there's no way at present to look up a signature in
        // the symbol table for an arbitrary type.  This is a temporary hack until that ability exists.
        // It will have false positives, since it doesn't check arg counts or types.
        if (arguments) {
            // Check if first argument is struct buffer type.  It may be an aggregate or a symbol, so we
            // look for either case.

            TIntermTyped* arg0 = nullptr;

            if (aggregate && aggregate->getSequence().size() > 0 && aggregate->getSequence()[0])
                arg0 = aggregate->getSequence()[0]->getAsTyped();
            else if (arguments->getAsSymbolNode())
                arg0 = arguments->getAsSymbolNode();

            if (arg0 != nullptr && isStructBufferType(arg0->getType())) {
                static const int methodPrefixSize = sizeof(BUILTIN_PREFIX)-1;

                if (function->getName().length() > methodPrefixSize &&
                    isStructBufferMethod(function->getName().substr(methodPrefixSize))) {
                    const TString mangle = function->getName() + "(";
                    TSymbol* symbol = symbolTable.find(mangle, &builtIn);

                    if (symbol)
                        fnCandidate = symbol->getAsFunction();
                }
            }
        }

        if (fnCandidate == nullptr)
            fnCandidate = findFunction(loc, *function, builtIn, thisDepth, arguments);

        if (fnCandidate) {
            // This is a declared function that might map to
            //  - a built-in operator,
            //  - a built-in function not mapped to an operator, or
            //  - a user function.

            // turn an implicit member-function resolution into an explicit call
            TString callerName;
            if (thisDepth == 0)
                callerName = fnCandidate->getMangledName();
            else {
                // get the explicit (full) name of the function
                callerName = currentTypePrefix[currentTypePrefix.size() - thisDepth];
                callerName += fnCandidate->getMangledName();
                // insert the implicit calling argument
                pushFrontArguments(intermediate.addSymbol(*getImplicitThis(thisDepth)), arguments);
            }

            // Convert 'in' arguments, so that types match.
            // However, skip those that need expansion, that is covered next.
            if (arguments)
                addInputArgumentConversions(*fnCandidate, arguments);

            // Expand arguments.  Some arguments must physically expand to a different set
            // than what the shader declared and passes.
            if (arguments && !builtIn)
                expandArguments(loc, *fnCandidate, arguments);

            // Expansion may have changed the form of arguments
            aggregate = arguments ? arguments->getAsAggregate() : nullptr;

            op = fnCandidate->getBuiltInOp();
            if (builtIn && op != EOpNull) {
                // SM 4.0 and above guarantees roundEven semantics for round()
                if (!hlslDX9Compatible() && op == EOpRound)
                    op = EOpRoundEven;

                // A function call mapped to a built-in operation.
                result = intermediate.addBuiltInFunctionCall(loc, op, fnCandidate->getParamCount() == 1, arguments,
                                                             fnCandidate->getType());
                if (result == nullptr)  {
                    error(arguments->getLoc(), " wrong operand type", "Internal Error",
                        "built in unary operator function.  Type: %s",
                        static_cast<TIntermTyped*>(arguments)->getCompleteString().c_str());
                } else if (result->getAsOperator()) {
                    builtInOpCheck(loc, *fnCandidate, *result->getAsOperator());
                }
            } else {
                // This is a function call not mapped to built-in operator.
                // It could still be a built-in function, but only if PureOperatorBuiltins == false.
                result = intermediate.setAggregateOperator(arguments, EOpFunctionCall, fnCandidate->getType(), loc);
                TIntermAggregate* call = result->getAsAggregate();
                call->setName(callerName);

                // this is how we know whether the given function is a built-in function or a user-defined function
                // if builtIn == false, it's a userDefined -> could be an overloaded built-in function also
                // if builtIn == true, it's definitely a built-in function with EOpNull
                if (! builtIn) {
                    call->setUserDefined();
                    intermediate.addToCallGraph(infoSink, currentCaller, callerName);
                }
            }

            // for decompositions, since we want to operate on the function node, not the aggregate holding
            // output conversions.
            const TIntermTyped* fnNode = result;

            decomposeStructBufferMethods(loc, result, arguments); // HLSL->AST struct buffer method decompositions
            decomposeIntrinsic(loc, result, arguments);           // HLSL->AST intrinsic decompositions
            decomposeSampleMethods(loc, result, arguments);       // HLSL->AST sample method decompositions
            decomposeGeometryMethods(loc, result, arguments);     // HLSL->AST geometry method decompositions

            // Create the qualifier list, carried in the AST for the call.
            // Because some arguments expand to multiple arguments, the qualifier list will
            // be longer than the formal parameter list.
            if (result == fnNode && result->getAsAggregate()) {
                TQualifierList& qualifierList = result->getAsAggregate()->getQualifierList();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    TStorageQualifier qual = (*fnCandidate)[i].type->getQualifier().storage;
                    if (hasStructBuffCounter(*(*fnCandidate)[i].type)) {
                        // add buffer and counter buffer argument qualifier
                        qualifierList.push_back(qual);
                        qualifierList.push_back(qual);
                    } else if (shouldFlatten(*(*fnCandidate)[i].type, (*fnCandidate)[i].type->getQualifier().storage,
                                             true)) {
                        // add structure member expansion
                        for (int memb = 0; memb < (int)(*fnCandidate)[i].type->getStruct()->size(); ++memb)
                            qualifierList.push_back(qual);
                    } else {
                        // Normal 1:1 case
                        qualifierList.push_back(qual);
                    }
                }
            }

            // Convert 'out' arguments.  If it was a constant folded built-in, it won't be an aggregate anymore.
            // Built-ins with a single argument aren't called with an aggregate, but they also don't have an output.
            // Also, build the qualifier list for user function calls, which are always called with an aggregate.
            // We don't do this is if there has been a decomposition, which will have added its own conversions
            // for output parameters.
            if (result == fnNode && result->getAsAggregate())
                result = addOutputArgumentConversions(*fnCandidate, *result->getAsOperator());
        }
    }

    // generic error recovery
    // TODO: simplification: localize all the error recoveries that look like this, and taking type into account to
    //       reduce cascades
    if (result == nullptr)
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);

    return result;
}